

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O1

void getSubVectors(HighsIndexCollection *index_collection,HighsInt data_dim,double *data0,
                  double *data1,double *data2,HighsSparseMatrix *matrix,HighsInt *num_sub_vector,
                  double *sub_vector_data0,double *sub_vector_data1,double *sub_vector_data2,
                  HighsInt *sub_matrix_num_nz,HighsInt *sub_matrix_start,HighsInt *sub_matrix_index,
                  double *sub_matrix_value)

{
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  HighsInt in_to_vector;
  HighsInt in_from_vector;
  HighsInt from_k;
  HighsInt local_84;
  HighsSparseMatrix *local_80;
  HighsInt local_78;
  int local_74;
  int local_70;
  int local_6c;
  double *local_68;
  double *local_60;
  double *local_58;
  HighsIndexCollection *local_50;
  ulong local_48;
  pointer local_40;
  HighsInt local_38;
  uint local_34;
  
  local_80 = matrix;
  local_68 = data0;
  local_60 = data1;
  local_58 = data2;
  local_50 = index_collection;
  limits(index_collection,(HighsInt *)&local_34,&local_6c);
  local_84 = -1;
  local_78 = 0;
  *num_sub_vector = 0;
  *sub_matrix_num_nz = 0;
  if ((int)local_34 <= local_6c) {
    do {
      local_48 = (ulong)local_34;
      updateOutInIndex(local_50,&local_70,&local_74,&local_38,&local_84,&local_78);
      lVar4 = (long)local_70;
      if (local_70 <= local_74) {
        piVar1 = (local_80->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_40 = piVar1 + lVar4;
        lVar5 = 0;
        do {
          if (sub_vector_data0 != (double *)0x0) {
            sub_vector_data0[*num_sub_vector] = local_68[lVar4 + lVar5];
          }
          if (sub_vector_data1 != (double *)0x0) {
            sub_vector_data1[*num_sub_vector] = local_60[lVar4 + lVar5];
          }
          if (sub_vector_data2 != (double *)0x0) {
            sub_vector_data2[*num_sub_vector] = local_58[lVar4 + lVar5];
          }
          if (sub_matrix_start != (HighsInt *)0x0) {
            sub_matrix_start[*num_sub_vector] =
                 (local_40[lVar5] + *sub_matrix_num_nz) - piVar1[lVar4];
          }
          *num_sub_vector = *num_sub_vector + 1;
          lVar5 = lVar5 + 1;
        } while ((local_74 - local_70) + 1 != (int)lVar5);
      }
      piVar1 = (local_80->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = (long)piVar1[lVar4];
      if (piVar1[lVar4] < piVar1[(long)local_74 + 1]) {
        piVar2 = (local_80->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3 = (local_80->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          if (sub_matrix_index != (HighsInt *)0x0) {
            sub_matrix_index[*sub_matrix_num_nz] = piVar2[lVar5];
          }
          if (sub_matrix_value != (double *)0x0) {
            sub_matrix_value[*sub_matrix_num_nz] = pdVar3[lVar5];
          }
          *sub_matrix_num_nz = *sub_matrix_num_nz + 1;
          lVar5 = lVar5 + 1;
        } while (lVar5 < piVar1[(long)local_74 + 1]);
      }
    } while (((local_74 != data_dim + -1) && (local_84 != data_dim + -1)) &&
            (local_34 = (int)local_48 + 1, (int)local_48 < local_6c));
  }
  return;
}

Assistant:

void getSubVectors(const HighsIndexCollection& index_collection,
                   const HighsInt data_dim, const double* data0,
                   const double* data1, const double* data2,
                   const HighsSparseMatrix& matrix, HighsInt& num_sub_vector,
                   double* sub_vector_data0, double* sub_vector_data1,
                   double* sub_vector_data2, HighsInt& sub_matrix_num_nz,
                   HighsInt* sub_matrix_start, HighsInt* sub_matrix_index,
                   double* sub_matrix_value) {
  // Ensure that if there's no data0 then it's not required in the
  // sub-vector
  if (data0 == nullptr) assert(sub_vector_data0 == nullptr);
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  // Surely this is checked elsewhere
  assert(0 <= from_k && to_k < data_dim);
  assert(from_k <= to_k);
  HighsInt out_from_vector;
  HighsInt out_to_vector;
  HighsInt in_from_vector;
  HighsInt in_to_vector = -1;
  HighsInt current_set_entry = 0;
  num_sub_vector = 0;
  sub_matrix_num_nz = 0;
  for (HighsInt k = from_k; k <= to_k; k++) {
    updateOutInIndex(index_collection, out_from_vector, out_to_vector,
                     in_from_vector, in_to_vector, current_set_entry);
    assert(out_to_vector < data_dim);
    assert(in_to_vector < data_dim);
    for (HighsInt iVector = out_from_vector; iVector <= out_to_vector;
         iVector++) {
      if (sub_vector_data0 != nullptr)
        sub_vector_data0[num_sub_vector] = data0[iVector];
      if (sub_vector_data1 != nullptr)
        sub_vector_data1[num_sub_vector] = data1[iVector];
      if (sub_vector_data2 != nullptr)
        sub_vector_data2[num_sub_vector] = data2[iVector];
      if (sub_matrix_start != nullptr)
        sub_matrix_start[num_sub_vector] = sub_matrix_num_nz +
                                           matrix.start_[iVector] -
                                           matrix.start_[out_from_vector];
      num_sub_vector++;
    }
    for (HighsInt iEl = matrix.start_[out_from_vector];
         iEl < matrix.start_[out_to_vector + 1]; iEl++) {
      if (sub_matrix_index != nullptr)
        sub_matrix_index[sub_matrix_num_nz] = matrix.index_[iEl];
      if (sub_matrix_value != nullptr)
        sub_matrix_value[sub_matrix_num_nz] = matrix.value_[iEl];
      sub_matrix_num_nz++;
    }
    if (out_to_vector == data_dim - 1 || in_to_vector == data_dim - 1) break;
  }
}